

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.h
# Opt level: O2

void __thiscall
ASTAR::astarSearcher::astarSearcher<ASTAR::EuclidianHeuristics>
          (astarSearcher *this,ProbabilisticRoadMap *G_ptr,EuclidianHeuristics *heuristic,
          vertex_t start_vertex,vertex_t goal_vertex)

{
  ptime pVar1;
  ostream *poVar2;
  AdjList *g;
  vertex_t start_vertex_local;
  EuclidianHeuristics local_88;
  bgl_named_params<ASTAR::astar_visitor,_boost::graph_visitor_t,_boost::bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>,_boost::vec_adj_list_vertex_id_map<std::shared_ptr<kdtree::vertex>,_unsigned_long>,_float,_float_&>,_boost::vertex_distance_t,_boost::bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_boost::vec_adj_list_vertex_id_map<std::shared_ptr<kdtree::vertex>,_unsigned_long>,_unsigned_long,_unsigned_long_&>,_boost::vertex_predecessor_t,_boost::no_property>_>_>
  local_70;
  
  boost::posix_time::ptime::ptime(&this->start_time);
  boost::posix_time::ptime::ptime(&this->stop_time);
  this->vertices_expanded = 0;
  (this->predecessor).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->predecessor).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->predecessor).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cost).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->cost).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->cost).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->shortest_path).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->shortest_path).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->shortest_path).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize
            (&this->cost,
             ((long)(G_ptr->graph).super_type.m_vertices.
                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(G_ptr->graph).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->predecessor,
             ((long)(G_ptr->graph).super_type.m_vertices.
                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(G_ptr->graph).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::undirectedS,_std::shared_ptr<kdtree::vertex>,_boost::property<boost::edge_weight_t,_float,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x28);
  this->prm = G_ptr;
  pVar1 = boost::date_time::microsec_clock<boost::posix_time::ptime>::local_time();
  local_70.m_value.vertices_expanded = &this->vertices_expanded;
  (this->start_time).
  super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  .time_.time_count_.value_ =
       (int_type_conflict)
       pVar1.
       super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
       .time_.time_count_.value_;
  local_88.G_ptr = heuristic->G_ptr;
  local_88.goal_vertex = heuristic->goal_vertex;
  local_70.m_base.m_base.m_value.iter._M_current =
       (float *)(this->predecessor).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_70.m_base.m_value.iter._M_current =
       (this->cost).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_70.m_value.goal_vertex = goal_vertex;
  boost::
  astar_search<boost::adjacency_list<boost::listS,boost::vecS,boost::undirectedS,std::shared_ptr<kdtree::vertex>,boost::property<boost::edge_weight_t,float,boost::no_property>,boost::no_property,boost::listS>,ASTAR::EuclidianHeuristics,ASTAR::astar_visitor,boost::graph_visitor_t,boost::bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,boost::vec_adj_list_vertex_id_map<std::shared_ptr<kdtree::vertex>,unsigned_long>,float,float&>,boost::vertex_distance_t,boost::bgl_named_params<boost::iterator_property_map<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,boost::vec_adj_list_vertex_id_map<std::shared_ptr<kdtree::vertex>,unsigned_long>,unsigned_long,unsigned_long&>,boost::vertex_predecessor_t,boost::no_property>>>
            (&G_ptr->graph,start_vertex,&local_88,&local_70);
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<(poVar2,"NO SOLUTION FOUND");
  std::endl<char,std::char_traits<char>>(poVar2);
  this->path_found = false;
  return;
}

Assistant:

astarSearcher(PRM::ProbabilisticRoadMap* G_ptr, Heuristic* heuristic, vertex_t start_vertex, vertex_t goal_vertex)
        {
            vertices_expanded=0;
            astar_visitor vis(&vertices_expanded);
            vis.set_goal(goal_vertex);
            cost.resize(boost::num_vertices(G_ptr->graph));
            predecessor.resize(boost::num_vertices(G_ptr->graph));
            prm = G_ptr;
            
            try
            {
                start_time = boost::posix_time::microsec_clock::local_time();
               // std::cout << std::endl << "Running Astar" << std::endl;
                boost::astar_search(G_ptr->graph, start_vertex, *heuristic,
                                    predecessor_map(make_iterator_property_map(predecessor.begin(), get(boost::vertex_index, G_ptr->graph))).
                                    distance_map(make_iterator_property_map(cost.begin(), get(boost::vertex_index, G_ptr->graph))).
                                    visitor(vis));
                //throw found_goal();
            }
            
            
            catch(found_goal fg)
            {
                path_found = true;
                stop_time = boost::posix_time::microsec_clock::local_time();
                // Walk backwards from the goal through the predecessor chain adding
                // vertices to the solution path.
                for (vertex_t u = goal_vertex; u != start_vertex; u = predecessor[u])
                {
                    shortest_path.push_back(u);
                }
                shortest_path.push_back(start_vertex);
                std::reverse(shortest_path.begin(),shortest_path.end());
                //std::cout << std::endl << "SHORTEST PATH FOUND" << std::endl;
                return;
                
            }
            
            std::cout << std::endl << "NO SOLUTION FOUND" << std::endl;
            path_found = false;
            
        }